

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaD_rawrunprotected(lua_State *L,Pfunc f,void *ud)

{
  int iVar1;
  lua_longjmp lj;
  lua_longjmp local_f0;
  
  local_f0.status = 0;
  local_f0.previous = L->errorJmp;
  L->errorJmp = &local_f0;
  iVar1 = _setjmp((__jmp_buf_tag *)local_f0.b);
  if (iVar1 == 0) {
    (*f)(L,ud);
  }
  L->errorJmp = local_f0.previous;
  return local_f0.status;
}

Assistant:

static int luaD_rawrunprotected(lua_State*L,Pfunc f,void*ud){
struct lua_longjmp lj;
lj.status=0;
lj.previous=L->errorJmp;
L->errorJmp=&lj;
LUAI_TRY(L,&lj,
(*f)(L,ud);
);
L->errorJmp=lj.previous;
return lj.status;
}